

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGPUShader5TextureGatherOffset.cpp
# Opt level: O3

void __thiscall
glcts::GPUShader5TextureGatherOffsetDepth2DRepeatYCaseTest::prepareTextureData
          (GPUShader5TextureGatherOffsetDepth2DRepeatYCaseTest *this,GLubyte *data)

{
  ulong uVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  GLuint ignored_bytes_per_pixel;
  GLenum ignored_texture_type;
  GLenum ignored_texture_format;
  GLenum ignored_texture_internal_format;
  GLuint texture_size;
  undefined1 local_24 [4];
  undefined1 local_20 [4];
  undefined1 local_1c [4];
  undefined1 local_18 [4];
  uint local_14;
  
  (**(code **)((long)(this->super_GPUShader5TextureGatherOffsetDepth2DRepeatCaseTest).
                     super_GPUShader5TextureGatherOffsetDepthTestBase.
                     super_GPUShader5TextureGatherOffsetTestBase.super_TestCaseBase.super_TestCase.
                     super_TestNode._vptr_TestNode + 0x40))
            (this,&local_14,local_18,local_1c,local_20,local_24);
  uVar1 = (ulong)local_14;
  if (uVar1 != 0) {
    lVar2 = 0;
    uVar3 = 0;
    do {
      uVar4 = 0;
      do {
        *(float *)(data + (ulong)(uint)((int)lVar2 + (int)uVar4) * 4) =
             (float)uVar3 * (1.0 / (float)uVar1);
        uVar4 = uVar4 + 1;
      } while (uVar1 != uVar4);
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + uVar1;
    } while (uVar3 != local_14);
  }
  return;
}

Assistant:

void GPUShader5TextureGatherOffsetDepth2DRepeatYCaseTest::prepareTextureData(glw::GLubyte* data)
{
	/* Data pointer */
	glw::GLfloat* texture_data = (glw::GLfloat*)data;

	/* Get texture info from GPUShader5TextureGatherOffsetDepthTestBase */
	glw::GLuint texture_size;
	glw::GLenum ignored_texture_internal_format;
	glw::GLenum ignored_texture_format;
	glw::GLenum ignored_texture_type;
	glw::GLuint ignored_bytes_per_pixel;

	getTextureInfo(texture_size, ignored_texture_internal_format, ignored_texture_format, ignored_texture_type,
				   ignored_bytes_per_pixel);

	/* Constants */
	const unsigned int n_components_per_pixel = 1;
	const unsigned int line_size			  = n_components_per_pixel * texture_size;
	const glw::GLfloat step					  = 1.0f / ((float)texture_size);

	/* Prepare texture's data */
	for (unsigned int y = 0; y < texture_size; ++y)
	{
		const glw::GLfloat depth = ((float)y) * step;

		for (unsigned int x = 0; x < texture_size; ++x)
		{
			const unsigned int pixel_offset = y * line_size + x * n_components_per_pixel;

			/* texel.depth = depth */
			texture_data[pixel_offset] = depth;
		}
	}
}